

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

string * __thiscall
CppGenerator::outputFinalRegTupleString_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,AggregateIndexes *idx,size_t numOfAggs,
          bitset<7UL> *increasing,size_t stringOffset)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  long *plVar4;
  ulong uVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  long *plVar8;
  undefined8 *puVar9;
  ulong uVar10;
  size_type *psVar11;
  ulong uVar12;
  char cVar13;
  undefined8 uVar14;
  bool bVar15;
  string k;
  string __str_6;
  string aggString;
  string aggIDString;
  string __str;
  string __str_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  undefined8 *local_108;
  long local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string *local_a8;
  bitset<7UL> *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  AggregateIndexes *local_90;
  ulong *local_88;
  uint local_80;
  undefined4 uStack_7c;
  ulong local_78 [2];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  size_t local_48;
  CppGenerator *local_40;
  long local_38;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  local_a8 = __return_storage_ptr__;
  local_a0 = increasing;
  local_40 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  local_38 = stringOffset * 3;
  local_98 = paVar1;
  local_48 = numOfAggs;
  if (numOfAggs < 3) {
    uVar5 = 0;
    local_90 = idx;
    do {
      uVar12 = ((long)((local_a0->super__Base_bitset<1UL>)._M_w << 0x3b) >> 0x3f & uVar5) +
               local_90->indexes[4];
      local_68 = &local_58;
      std::__cxx11::string::_M_construct((ulong)&local_68,(char)local_38);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
      puVar7 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_c8.field_2._M_allocated_capacity = *puVar7;
        local_c8.field_2._8_8_ = plVar4[3];
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *puVar7;
        local_c8._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_c8._M_string_length = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_c8,
                                  (ulong)local_40->viewName[local_90->indexes[3]]._M_dataplus._M_p);
      local_128 = &local_118;
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_118 = *plVar8;
        lStack_110 = plVar4[3];
      }
      else {
        local_118 = *plVar8;
        local_128 = (long *)*plVar4;
      }
      local_120 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      puVar7 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_148.field_2._M_allocated_capacity = *puVar7;
        local_148.field_2._8_8_ = plVar4[3];
      }
      else {
        local_148.field_2._M_allocated_capacity = *puVar7;
        local_148._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_148._M_string_length = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      cVar13 = '\x01';
      if (9 < uVar12) {
        uVar10 = uVar12;
        cVar3 = '\x04';
        do {
          cVar13 = cVar3;
          if (uVar10 < 100) {
            cVar13 = cVar13 + -2;
            goto LAB_0023f8fd;
          }
          if (uVar10 < 1000) {
            cVar13 = cVar13 + -1;
            goto LAB_0023f8fd;
          }
          if (uVar10 < 10000) goto LAB_0023f8fd;
          bVar15 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar3 = cVar13 + '\x04';
        } while (bVar15);
        cVar13 = cVar13 + '\x01';
      }
LAB_0023f8fd:
      local_88 = local_78;
      std::__cxx11::string::_M_construct((ulong)&local_88,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_88,local_80,uVar12);
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        uVar14 = local_148.field_2._M_allocated_capacity;
      }
      uVar12 = CONCAT44(uStack_7c,local_80) + local_148._M_string_length;
      if ((ulong)uVar14 < uVar12) {
        uVar10 = 0xf;
        if (local_88 != local_78) {
          uVar10 = local_78[0];
        }
        if (uVar10 < uVar12) goto LAB_0023f98c;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_88,0,(char *)0x0,(ulong)local_148._M_dataplus._M_p);
      }
      else {
LAB_0023f98c:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_88);
      }
      puVar9 = puVar6 + 2;
      if ((undefined8 *)*puVar6 == puVar9) {
        local_f8 = *puVar9;
        uStack_f0 = puVar6[3];
        local_108 = &local_f8;
      }
      else {
        local_f8 = *puVar9;
        local_108 = (undefined8 *)*puVar6;
      }
      local_100 = puVar6[1];
      *puVar6 = puVar9;
      puVar6[1] = 0;
      *(undefined1 *)puVar9 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_108);
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_d8 = *plVar8;
        lStack_d0 = plVar4[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *plVar8;
        local_e8 = (long *)*plVar4;
      }
      local_e0 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_a8,(ulong)local_e8);
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108);
      }
      if (local_88 != local_78) {
        operator_delete(local_88);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      if (local_128 != &local_118) {
        operator_delete(local_128);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if (local_68 != &local_58) {
        operator_delete(local_68);
      }
      local_e8 = &local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8);
      if (((local_90->present).super__Base_bitset<1UL>._M_w & 1) != 0) {
        uVar12 = (-(ulong)((uint)(local_a0->super__Base_bitset<1UL>)._M_w & 1) & uVar5) +
                 local_90->indexes[0];
        cVar13 = '\x01';
        if (9 < uVar12) {
          uVar10 = uVar12;
          cVar3 = '\x04';
          do {
            cVar13 = cVar3;
            if (uVar10 < 100) {
              cVar13 = cVar13 + -2;
              goto LAB_0023fb85;
            }
            if (uVar10 < 1000) {
              cVar13 = cVar13 + -1;
              goto LAB_0023fb85;
            }
            if (uVar10 < 10000) goto LAB_0023fb85;
            bVar15 = 99999 < uVar10;
            uVar10 = uVar10 / 10000;
            cVar3 = cVar13 + '\x04';
          } while (bVar15);
          cVar13 = cVar13 + '\x01';
        }
LAB_0023fb85:
        local_128 = &local_118;
        std::__cxx11::string::_M_construct((ulong)&local_128,cVar13);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_128,(uint)local_120,uVar12);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x2b3ae7);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        puVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_148.field_2._M_allocated_capacity = *puVar7;
          local_148.field_2._8_8_ = puVar6[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *puVar7;
          local_148._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_148._M_string_length = puVar6[1];
        *puVar6 = puVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
        puVar9 = puVar6 + 2;
        if ((undefined8 *)*puVar6 == puVar9) {
          local_f8 = *puVar9;
          uStack_f0 = puVar6[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *puVar9;
          local_108 = (undefined8 *)*puVar6;
        }
        local_100 = puVar6[1];
        *puVar6 = puVar9;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_108);
        if (local_108 != &local_f8) {
          operator_delete(local_108);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        if (local_128 != &local_118) {
          operator_delete(local_128);
        }
      }
      if (((local_90->present).super__Base_bitset<1UL>._M_w & 2) != 0) {
        uVar12 = ((long)((local_a0->super__Base_bitset<1UL>)._M_w << 0x3e) >> 0x3f & uVar5) +
                 local_90->indexes[1];
        cVar13 = '\x01';
        if (9 < uVar12) {
          uVar10 = uVar12;
          cVar3 = '\x04';
          do {
            cVar13 = cVar3;
            if (uVar10 < 100) {
              cVar13 = cVar13 + -2;
              goto LAB_0023fd31;
            }
            if (uVar10 < 1000) {
              cVar13 = cVar13 + -1;
              goto LAB_0023fd31;
            }
            if (uVar10 < 10000) goto LAB_0023fd31;
            bVar15 = 99999 < uVar10;
            uVar10 = uVar10 / 10000;
            cVar3 = cVar13 + '\x04';
          } while (bVar15);
          cVar13 = cVar13 + '\x01';
        }
LAB_0023fd31:
        local_128 = &local_118;
        std::__cxx11::string::_M_construct((ulong)&local_128,cVar13);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_128,(uint)local_120,uVar12);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x2b3b2c);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        puVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_148.field_2._M_allocated_capacity = *puVar7;
          local_148.field_2._8_8_ = puVar6[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *puVar7;
          local_148._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_148._M_string_length = puVar6[1];
        *puVar6 = puVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
        puVar9 = puVar6 + 2;
        if ((undefined8 *)*puVar6 == puVar9) {
          local_f8 = *puVar9;
          uStack_f0 = puVar6[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *puVar9;
          local_108 = (undefined8 *)*puVar6;
        }
        local_100 = puVar6[1];
        *puVar6 = puVar9;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_108);
        if (local_108 != &local_f8) {
          operator_delete(local_108);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        if (local_128 != &local_118) {
          operator_delete(local_128);
        }
      }
      if (((local_90->present).super__Base_bitset<1UL>._M_w & 4) != 0) {
        uVar12 = ((long)((local_a0->super__Base_bitset<1UL>)._M_w << 0x3d) >> 0x3f & uVar5) +
                 local_90->indexes[2];
        cVar13 = '\x01';
        if (9 < uVar12) {
          uVar10 = uVar12;
          cVar3 = '\x04';
          do {
            cVar13 = cVar3;
            if (uVar10 < 100) {
              cVar13 = cVar13 + -2;
              goto LAB_0023fee5;
            }
            if (uVar10 < 1000) {
              cVar13 = cVar13 + -1;
              goto LAB_0023fee5;
            }
            if (uVar10 < 10000) goto LAB_0023fee5;
            bVar15 = 99999 < uVar10;
            uVar10 = uVar10 / 10000;
            cVar3 = cVar13 + '\x04';
          } while (bVar15);
          cVar13 = cVar13 + '\x01';
        }
LAB_0023fee5:
        local_128 = &local_118;
        std::__cxx11::string::_M_construct((ulong)&local_128,cVar13);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_128,(uint)local_120,uVar12);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x2b3ae7);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        puVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_148.field_2._M_allocated_capacity = *puVar7;
          local_148.field_2._8_8_ = puVar6[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *puVar7;
          local_148._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_148._M_string_length = puVar6[1];
        *puVar6 = puVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
        puVar9 = puVar6 + 2;
        if ((undefined8 *)*puVar6 == puVar9) {
          local_f8 = *puVar9;
          uStack_f0 = puVar6[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *puVar9;
          local_108 = (undefined8 *)*puVar6;
        }
        local_100 = puVar6[1];
        *puVar6 = puVar9;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_108);
        if (local_108 != &local_f8) {
          operator_delete(local_108);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        if (local_128 != &local_118) {
          operator_delete(local_128);
        }
      }
      if (local_e0 == 0) {
        std::__cxx11::string::_M_replace((ulong)&local_e8,0,(char *)0x0,0x2b43a5);
      }
      else {
        std::__cxx11::string::pop_back();
      }
      std::__cxx11::string::_M_append((char *)local_a8,(ulong)local_e8);
      std::__cxx11::string::append((char *)local_a8);
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      bVar15 = uVar5 == local_48;
      uVar5 = uVar5 + 1;
      if (bVar15) {
        return local_a8;
      }
    } while( true );
  }
  local_128 = &local_118;
  std::__cxx11::string::_M_construct((ulong)&local_128,(char)local_38);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
  paVar1 = &local_148.field_2;
  puVar7 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_148.field_2._M_allocated_capacity = *puVar7;
    local_148.field_2._8_8_ = plVar4[3];
    local_148._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_148.field_2._M_allocated_capacity = *puVar7;
    local_148._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_148._M_string_length = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar5 = local_48 + 1;
  cVar13 = '\x01';
  if (9 < uVar5) {
    uVar12 = uVar5;
    cVar3 = '\x04';
    do {
      cVar13 = cVar3;
      if (uVar12 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0024011e;
      }
      if (uVar12 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0024011e;
      }
      if (uVar12 < 10000) goto LAB_0024011e;
      bVar15 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar3 = cVar13 + '\x04';
    } while (bVar15);
    cVar13 = cVar13 + '\x01';
  }
LAB_0024011e:
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_c8,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_c8._M_dataplus._M_p,(uint)local_c8._M_string_length,uVar5);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    uVar14 = local_148.field_2._M_allocated_capacity;
  }
  paVar2 = &local_c8.field_2;
  if ((ulong)uVar14 < local_c8._M_string_length + local_148._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar2) {
      uVar14 = local_c8.field_2._M_allocated_capacity;
    }
    if (local_c8._M_string_length + local_148._M_string_length <= (ulong)uVar14) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_c8,0,(char *)0x0,(ulong)local_148._M_dataplus._M_p);
      goto LAB_002401c2;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_c8._M_dataplus._M_p);
LAB_002401c2:
  local_108 = &local_f8;
  puVar9 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar9) {
    local_f8 = *puVar9;
    uStack_f0 = puVar6[3];
  }
  else {
    local_f8 = *puVar9;
    local_108 = (undefined8 *)*puVar6;
  }
  local_100 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_108);
  local_e8 = &local_d8;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_d8 = *plVar8;
    lStack_d0 = plVar4[3];
  }
  else {
    local_d8 = *plVar8;
    local_e8 = (long *)*plVar4;
  }
  local_e0 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_a8,(ulong)local_e8);
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128);
  }
  uVar5 = idx->indexes[4];
  cVar13 = '\x01';
  if (9 < uVar5) {
    uVar12 = uVar5;
    cVar3 = '\x04';
    do {
      cVar13 = cVar3;
      if (uVar12 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0024032a;
      }
      if (uVar12 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0024032a;
      }
      if (uVar12 < 10000) goto LAB_0024032a;
      bVar15 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar3 = cVar13 + '\x04';
    } while (bVar15);
    cVar13 = cVar13 + '\x01';
  }
LAB_0024032a:
  local_e8 = &local_d8;
  std::__cxx11::string::_M_construct((ulong)&local_e8,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e8,(uint)local_e0,uVar5);
  if (((local_a0->super__Base_bitset<1UL>)._M_w & 0x10) != 0) {
    std::__cxx11::string::append((char *)&local_e8);
  }
  local_88 = local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,(char)stringOffset * '\x03' + '\x03');
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_58 = *plVar8;
    lStack_50 = plVar4[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar8;
    local_68 = (long *)*plVar4;
  }
  local_60 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_68,
                              (ulong)local_40->viewName[idx->indexes[3]]._M_dataplus._M_p);
  psVar11 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_c8.field_2._M_allocated_capacity = *psVar11;
    local_c8.field_2._8_8_ = plVar4[3];
    local_c8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar11;
    local_c8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_c8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar11;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_128 = &local_118;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_118 = *plVar8;
    lStack_110 = plVar4[3];
  }
  else {
    local_118 = *plVar8;
    local_128 = (long *)*plVar4;
  }
  local_120 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_e8);
  psVar11 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_148.field_2._M_allocated_capacity = *psVar11;
    local_148.field_2._8_8_ = plVar4[3];
    local_148._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_148.field_2._M_allocated_capacity = *psVar11;
    local_148._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_148._M_string_length = plVar4[1];
  *plVar4 = (long)psVar11;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
  puVar9 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar9) {
    local_f8 = *puVar9;
    uStack_f0 = puVar6[3];
    local_108 = &local_f8;
  }
  else {
    local_f8 = *puVar9;
    local_108 = (undefined8 *)*puVar6;
  }
  local_100 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_a8,(ulong)local_108);
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  local_108 = &local_f8;
  std::__cxx11::string::_M_construct<char_const*>();
  if (((idx->present).super__Base_bitset<1UL>._M_w & 1) != 0) {
    uVar5 = idx->indexes[0];
    cVar13 = '\x01';
    if (9 < uVar5) {
      uVar12 = uVar5;
      cVar3 = '\x04';
      do {
        cVar13 = cVar3;
        if (uVar12 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_0024066e;
        }
        if (uVar12 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_0024066e;
        }
        if (uVar12 < 10000) goto LAB_0024066e;
        bVar15 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        cVar3 = cVar13 + '\x04';
      } while (bVar15);
      cVar13 = cVar13 + '\x01';
    }
LAB_0024066e:
    local_148._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_148,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_148._M_dataplus._M_p,(uint)local_148._M_string_length,uVar5);
    if (((local_a0->super__Base_bitset<1UL>)._M_w & 1) != 0) {
      std::__cxx11::string::append((char *)&local_148);
    }
    std::operator+(&local_c8,"aggregateRegister[",&local_148);
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
    plVar4 = puVar6 + 2;
    if ((long *)*puVar6 == plVar4) {
      local_118 = *plVar4;
      lStack_110 = puVar6[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar4;
      local_128 = (long *)*puVar6;
    }
    local_120 = puVar6[1];
    *puVar6 = plVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_128);
    if (local_128 != &local_118) {
      operator_delete(local_128);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p);
    }
  }
  if (((idx->present).super__Base_bitset<1UL>._M_w & 2) != 0) {
    uVar5 = idx->indexes[1];
    cVar13 = '\x01';
    if (9 < uVar5) {
      uVar12 = uVar5;
      cVar3 = '\x04';
      do {
        cVar13 = cVar3;
        if (uVar12 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_002407c2;
        }
        if (uVar12 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_002407c2;
        }
        if (uVar12 < 10000) goto LAB_002407c2;
        bVar15 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        cVar3 = cVar13 + '\x04';
      } while (bVar15);
      cVar13 = cVar13 + '\x01';
    }
LAB_002407c2:
    local_148._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_148,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_148._M_dataplus._M_p,(uint)local_148._M_string_length,uVar5);
    if (((local_a0->super__Base_bitset<1UL>)._M_w & 2) != 0) {
      std::__cxx11::string::append((char *)&local_148);
    }
    std::operator+(&local_c8,"postRegister[",&local_148);
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
    plVar4 = puVar6 + 2;
    if ((long *)*puVar6 == plVar4) {
      local_118 = *plVar4;
      lStack_110 = puVar6[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar4;
      local_128 = (long *)*puVar6;
    }
    local_120 = puVar6[1];
    *puVar6 = plVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_128);
    if (local_128 != &local_118) {
      operator_delete(local_128);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p);
    }
  }
  if (((idx->present).super__Base_bitset<1UL>._M_w & 4) != 0) {
    uVar5 = idx->indexes[2];
    cVar13 = '\x01';
    if (9 < uVar5) {
      uVar12 = uVar5;
      cVar3 = '\x04';
      do {
        cVar13 = cVar3;
        if (uVar12 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_00240916;
        }
        if (uVar12 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_00240916;
        }
        if (uVar12 < 10000) goto LAB_00240916;
        bVar15 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        cVar3 = cVar13 + '\x04';
      } while (bVar15);
      cVar13 = cVar13 + '\x01';
    }
LAB_00240916:
    local_148._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_148,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_148._M_dataplus._M_p,(uint)local_148._M_string_length,uVar5);
    if (((local_a0->super__Base_bitset<1UL>)._M_w & 4) != 0) {
      std::__cxx11::string::append((char *)&local_148);
    }
    std::operator+(&local_c8,"aggregateRegister[",&local_148);
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
    plVar4 = puVar6 + 2;
    if ((long *)*puVar6 == plVar4) {
      local_118 = *plVar4;
      lStack_110 = puVar6[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar4;
      local_128 = (long *)*puVar6;
    }
    local_120 = puVar6[1];
    *puVar6 = plVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_128);
    if (local_128 != &local_118) {
      operator_delete(local_128);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p);
    }
  }
  if (local_100 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_108,0,(char *)0x0,0x2b3dc7);
  }
  else {
    std::__cxx11::string::pop_back();
  }
  std::__cxx11::string::_M_append((char *)local_a8,(ulong)local_108);
  std::__cxx11::string::append((char *)local_a8);
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  return local_a8;
}

Assistant:

std::string CppGenerator::outputFinalRegTupleString(
    AggregateIndexes& idx, size_t numOfAggs, const std::bitset<7>& increasing,
    size_t stringOffset)
{
    std::string outString = "";
    
    if (numOfAggs > LOOPIFY_THRESHOLD)
    {
        outString += offset(stringOffset)+
            "for (size_t i = 0; i < "+std::to_string(numOfAggs+1)+";++i)\n";

        std::string aggIDString = std::to_string(idx.indexes[4]);
        if (increasing[4])
            aggIDString += "+i";
        
        outString += offset(stringOffset+1)+"aggregates_"+viewName[idx.indexes[3]]+
            "["+aggIDString+"] += ";

        std::string aggString = "";
        if (idx.present[0])
        {
            std::string k = std::to_string(idx.indexes[0]);
            if (increasing[0])
                k += "+i";
            aggString +="aggregateRegister["+k+"]*";
        }

        if (idx.present[1])
        {
            std::string k = std::to_string(idx.indexes[1]);
            if (increasing[1])
                k += "+i";
            aggString +="postRegister["+k+"]*";
        }

        if (idx.present[2])
        {
            std::string k = std::to_string(idx.indexes[2]);
            if (increasing[2])
                k += "+i";
            aggString +="aggregateRegister["+k+"]*";
        }

        if (aggString.empty())
        {
            // std::cout << "aggString is empty - compressed!\n";
            aggString = "1*";
        }
        else
            aggString.pop_back();
        
        outString += aggString;
        outString += ";\n";
    }
    else
    {
        // Print out all aggregates individually
        for (size_t i = 0; i < numOfAggs+1; ++i)
        {
            size_t aggID = idx.indexes[4];
            if (increasing[4])
                aggID += i;
        
            // We use a mapping to the correct index
            outString += offset(stringOffset)+"aggregates_"+viewName[idx.indexes[3]]+
                "["+std::to_string(aggID)+"] += ";

            std::string aggString = "";
            
            if (idx.present[0])
            {
                size_t k = idx.indexes[0];
                if (increasing[0])
                    k += i;
                aggString +="aggregateRegister["+std::to_string(k)+"]*";
            }
            
            if (idx.present[1])
            {
                size_t k = idx.indexes[1];
                if (increasing[1])
                    k += i;
                aggString +="postRegister["+std::to_string(k)+"]*";
            }

            if (idx.present[2])
            {
                size_t k = idx.indexes[2];
                if (increasing[2])
                    k += i;
                aggString +="aggregateRegister["+std::to_string(k)+"]*";
            }

            if (aggString.empty())
            {
                // std::cout << "aggString is empty --- non-compressed !\n";
                aggString = "1";
            }
            else
                aggString.pop_back();
        
            outString += aggString;
            outString += ";\n";
        }
    }

    return outString;
}